

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dims_filter_initialize_dynamic_dims_array.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  array<unsigned_long,_1UL> *paVar2;
  array<unsigned_long,_2UL> *paVar3;
  array<unsigned_long,_3UL> local_1d8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  array<unsigned_long,_3UL> local_1a8;
  array<unsigned_long,_2UL> local_190;
  undefined8 local_180;
  undefined8 local_178;
  array<unsigned_long,_2UL> local_170;
  array<unsigned_long,_2UL> local_160;
  undefined8 local_150;
  undefined8 local_148;
  array<unsigned_long,_2UL> local_140;
  array<unsigned_long,_2UL> local_130;
  undefined8 local_120;
  undefined8 local_118;
  array<unsigned_long,_2UL> local_110;
  array<unsigned_long,_1UL> local_100;
  undefined8 local_f8;
  array<unsigned_long,_1UL> local_f0;
  array<unsigned_long,_1UL> local_e8;
  undefined8 local_e0;
  array<unsigned_long,_1UL> local_d8;
  array<unsigned_long,_1UL> local_d0;
  undefined8 local_c8;
  array<unsigned_long,_1UL> local_c0;
  array<unsigned_long,_0UL> local_b4 [3];
  array<unsigned_long,_0UL> local_b1;
  array<unsigned_long,_2UL> local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  array<unsigned_long,_2UL> local_90;
  array<unsigned_long,_1UL> local_80;
  undefined8 local_78;
  array<unsigned_long,_1UL> local_70;
  array<unsigned_long,_1UL> local_68;
  undefined8 local_60;
  array<unsigned_long,_1UL> local_58;
  array<unsigned_long,_0UL> local_4c [3];
  array<unsigned_long,_0UL> local_49;
  array<unsigned_long,_1UL> local_48;
  undefined8 local_40;
  array<unsigned_long,_1UL> local_38;
  array<unsigned_long,_0UL> local_2c [3];
  array<unsigned_long,_0UL> local_29;
  array<unsigned_long,_1UL> local_28;
  undefined8 local_20;
  array<unsigned_long,_1UL> local_18;
  array<unsigned_long,_0UL> local_10 [3];
  array<unsigned_long,_0UL> local_d;
  undefined4 local_c;
  
  local_c = 0;
  std::experimental::detail::filter_initialize_dynamic_dims_array<int,std::array<unsigned_long,0ul>>
            (0);
  boost::detail::test_eq_impl<std::array<unsigned_long,0ul>,std::array<unsigned_long,0ul>>
            ("(filter_initialize_dynamic_dims_array (0, sz_array<0>{{ }}))","(sz_array<0>{{ }})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x25,"int main()",&local_d,local_10);
  local_20 = 0;
  local_18 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<int,std::array<unsigned_long,1ul>>
                       (0,(array<unsigned_long,_1UL>)0x0);
  local_28._M_elems[0] = (_Type)0;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array (0, sz_array<1>{{0}}))","(sz_array<1>{{0}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x29,"int main()",&local_18,&local_28);
  std::experimental::detail::
  filter_initialize_dynamic_dims_array<3UL,_int,_std::array<unsigned_long,_0UL>,_int>(0,3);
  boost::detail::test_eq_impl<std::array<unsigned_long,0ul>,std::array<unsigned_long,0ul>>
            ("(filter_initialize_dynamic_dims_array < 3>(0, sz_array<0>{{ }}, 3))",
             "(sz_array<0>{{ }})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x2e,"int main()",&local_29,local_2c);
  local_40 = 0;
  local_38 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<18446744073709551615UL,_int,_std::array<unsigned_long,_1UL>,_int>
                       (0,(array<unsigned_long,_1UL>)0x0,3);
  local_48._M_elems[0] = (_Type)3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn>(0, sz_array<1>{{0}}, 3))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x32,"int main()",&local_38,&local_48);
  std::experimental::detail::
  filter_initialize_dynamic_dims_array<3ul,5ul,int,std::array<unsigned_long,0ul>,int,int>(0,1,2);
  boost::detail::test_eq_impl<std::array<unsigned_long,0ul>,std::array<unsigned_long,0ul>>
            ("(filter_initialize_dynamic_dims_array < 3, 5>(0, sz_array<0>{{ }}, 1, 2))",
             "(sz_array<0>{{ }})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x37,"int main()",&local_49,local_4c);
  local_60 = 0;
  local_58 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<18446744073709551615ul,5ul,int,std::array<unsigned_long,1ul>,int,int>
                       (0,(array<unsigned_long,_1UL>)0x0,3,5);
  local_68._M_elems[0] = (_Type)3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5>(0, sz_array<1>{{0}}, 3, 5))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x3b,"int main()",&local_58,&local_68);
  local_78 = 0;
  local_70 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<3ul,18446744073709551615ul,int,std::array<unsigned_long,1ul>,int,int>
                       (0,(array<unsigned_long,_1UL>)0x0,3,5);
  local_80._M_elems[0] = (_Type)5;
  paVar2 = &local_70;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn>(0, sz_array<1>{{0}}, 3, 5))",
             "(sz_array<1>{{5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x3f,"int main()",paVar2,&local_80);
  local_a0 = 0;
  local_98 = 0;
  local_90 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<18446744073709551615ul,18446744073709551615ul,int,std::array<unsigned_long,2ul>,int,int>
                       ((detail *)0x0,0,(array<unsigned_long,_2UL>)(ZEXT816(3) << 0x40),5,
                        (int)paVar2);
  local_b0._M_elems[0] = 3;
  local_b0._M_elems[1] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5))",
             "(sz_array<2>{{3, 5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x43,"int main()",&local_90,&local_b0);
  std::experimental::detail::
  filter_initialize_dynamic_dims_array<3ul,5ul,9ul,int,std::array<unsigned_long,0ul>,int,int,int>
            (0,3,5,9);
  boost::detail::test_eq_impl<std::array<unsigned_long,0ul>,std::array<unsigned_long,0ul>>
            ("(filter_initialize_dynamic_dims_array < 3, 5, 9>(0, sz_array<0>{{ }}, 3, 5, 9))",
             "(sz_array<0>{{ }})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x48,"int main()",&local_b1,local_b4);
  local_c8 = 0;
  local_c0 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<18446744073709551615ul,5ul,9ul,int,std::array<unsigned_long,1ul>,int,int,int>
                       (0,(array<unsigned_long,_1UL>)0x0,3,5,9);
  local_d0._M_elems[0] = (_Type)3;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5, 9>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{3}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x4d,"int main()",&local_c0,&local_d0);
  local_e0 = 0;
  local_d8 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<3ul,18446744073709551615ul,9ul,int,std::array<unsigned_long,1ul>,int,int,int>
                       (0,(array<unsigned_long,_1UL>)0x0,3,5,9);
  local_e8._M_elems[0] = (_Type)5;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn, 9>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x51,"int main()",&local_d8,&local_e8);
  local_f8 = 0;
  local_f0 = std::experimental::detail::
             filter_initialize_dynamic_dims_array<3ul,5ul,18446744073709551615ul,int,std::array<unsigned_long,1ul>,int,int,int>
                       (0,(array<unsigned_long,_1UL>)0x0,3,5,9);
  local_100._M_elems[0] = (_Type)9;
  paVar2 = &local_100;
  boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
            ("(filter_initialize_dynamic_dims_array < 3, 5, dyn>(0, sz_array<1>{{0}}, 3, 5, 9))",
             "(sz_array<1>{{9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x55,"int main()",&local_f0,paVar2);
  local_120 = 0;
  local_118 = 0;
  local_110 = std::experimental::detail::
              filter_initialize_dynamic_dims_array<3ul,18446744073709551615ul,18446744073709551615ul,int,std::array<unsigned_long,2ul>,int,int,int>
                        ((detail *)0x0,0,(array<unsigned_long,_2UL>)(ZEXT816(3) << 0x40),5,9,
                         (int)paVar2);
  local_130._M_elems[0] = 5;
  local_130._M_elems[1] = 9;
  paVar3 = &local_130;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array < 3, dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{5, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x5a,"int main()",&local_110,paVar3);
  local_150 = 0;
  local_148 = 0;
  local_140 = std::experimental::detail::
              filter_initialize_dynamic_dims_array<18446744073709551615ul,5ul,18446744073709551615ul,int,std::array<unsigned_long,2ul>,int,int,int>
                        ((detail *)0x0,0,(array<unsigned_long,_2UL>)(ZEXT816(3) << 0x40),5,9,
                         (int)paVar3);
  local_160._M_elems[0] = 3;
  local_160._M_elems[1] = 9;
  paVar3 = &local_160;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, 5, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{3, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x5e,"int main()",&local_140,paVar3);
  local_180 = 0;
  local_178 = 0;
  local_170 = std::experimental::detail::
              filter_initialize_dynamic_dims_array<18446744073709551615ul,18446744073709551615ul,9ul,int,std::array<unsigned_long,2ul>,int,int,int>
                        ((detail *)0x0,0,(array<unsigned_long,_2UL>)(ZEXT816(3) << 0x40),5,9,
                         (int)paVar3);
  local_190._M_elems[0] = 3;
  local_190._M_elems[1] = 5;
  boost::detail::test_eq_impl<std::array<unsigned_long,2ul>,std::array<unsigned_long,2ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn, 9>(0, sz_array<2>{{0, 0}}, 3, 5, 9))"
             ,"(sz_array<2>{{3, 5}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x62,"int main()",&local_170,&local_190);
  memset(&local_1c0,0,0x18);
  local_1c0 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  std::experimental::detail::
  filter_initialize_dynamic_dims_array<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul,int,std::array<unsigned_long,3ul>,int,int,int>
            (&local_1a8,(detail *)0x0,3,(array<unsigned_long,_3UL>)ZEXT824(0),5,9,0);
  local_1d8._M_elems[0] = 3;
  local_1d8._M_elems[1] = 5;
  local_1d8._M_elems[2] = 9;
  boost::detail::test_eq_impl<std::array<unsigned_long,3ul>,std::array<unsigned_long,3ul>>
            ("(filter_initialize_dynamic_dims_array <dyn, dyn, dyn>(0, sz_array<3>{{0, 0, 0}}, 3, 5, 9))"
             ,"(sz_array<3>{{3, 5, 9}})",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_filter_initialize_dynamic_dims_array.cpp"
             ,0x67,"int main()",&local_1a8,&local_1d8);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        (0, sz_array<0>{{ }}))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        (0, sz_array<1>{{0}}))
      , (sz_array<1>{{0}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3>(0, sz_array<0>{{ }}, 3))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn>(0, sz_array<1>{{0}}, 3))
      , (sz_array<1>{{3}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5>(0, sz_array<0>{{ }}, 1, 2))
      , (sz_array<0>{{ }})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5>(0, sz_array<1>{{0}}, 3, 5))
      , (sz_array<1>{{3}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn>(0, sz_array<1>{{0}}, 3, 5))
      , (sz_array<1>{{5}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5))
      , (sz_array<2>{{3, 5}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5,   9>(0, sz_array<0>{{ }}, 3, 5, 9))
      , (sz_array<0>{{ }})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5,   9>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{3}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn,   9>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{5}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3,   5, dyn>(0, sz_array<1>{{0}}, 3, 5, 9))
      , (sz_array<1>{{9}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <  3, dyn, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{5, 9}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn,   5, dyn>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{3, 9}})
    );
    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn,   9>(0, sz_array<2>{{0, 0}}, 3, 5, 9))
      , (sz_array<2>{{3, 5}})
    );

    BOOST_TEST_EQ((filter_initialize_dynamic_dims_array
        <dyn, dyn, dyn>(0, sz_array<3>{{0, 0, 0}}, 3, 5, 9))
      , (sz_array<3>{{3, 5, 9}})
    );

    return boost::report_errors();
}